

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

int roundTripString_rtripconversions_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<roundTripString> *this_01;
  TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *meta_factory;
  allocator local_c3;
  allocator local_c2;
  allocator local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  char local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string((string *)&local_30,"roundTripString",&local_c1);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
             ,&local_c2);
  local_58.file._M_string_length = local_98;
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_58.file.field_2._8_8_ = uStack_88;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90[0] = '\0';
  local_58.line = 0x78;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<roundTripString>(this_00,&local_30,&local_58);
  meta_factory = (TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_001b3db8;
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
             ,&local_c3);
  local_80.file._M_string_length = local_b8;
  local_80.file._M_dataplus._M_p = (pointer)&local_80.file.field_2;
  if (local_c0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0) {
    local_80.file.field_2._8_8_ = uStack_a8;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_b8 = 0;
  local_b0[0] = '\0';
  local_80.line = 0x78;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0;
  testing::internal::ParameterizedTestSuiteInfo<roundTripString>::AddTestPattern
            (this_01,"roundTripString","rtripconversions",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

TEST_P(roundTripString, rtripconversions)
{
    auto u1 = unit_from_string(GetParam());
    EXPECT_FALSE(is_error(u1));
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_FALSE(is_error(u2));
    EXPECT_EQ(unit_cast(u2), unit_cast(u1));
}